

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageClipper.cpp
# Opt level: O0

void countCoverage(string *filename)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *this;
  reference pvVar6;
  size_type sVar7;
  int endPair1;
  bool firstAlignment;
  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  positions;
  int maxDepth;
  int currentEnd;
  int currentStart;
  BamAlignment alignment;
  BamReader bamreader;
  value_type *in_stack_fffffffffffffd78;
  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *in_stack_fffffffffffffd80;
  int local_1a4;
  BamAlignment local_198 [172];
  int local_ec;
  string local_40 [48];
  BamReader local_10 [16];
  
  BamTools::BamReader::BamReader(local_10);
  bVar2 = BamTools::BamReader::Open((string *)local_10);
  if ((bVar2 & 1) != 0) {
    BamTools::BamAlignment::BamAlignment(local_198);
    local_1a4 = 0;
    std::queue<std::pair<int,int>,std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
    ::queue<std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>,void>
              (in_stack_fffffffffffffd80);
    bVar1 = true;
    while (bVar2 = BamTools::BamReader::GetNextAlignment((BamAlignment *)local_10), (bVar2 & 1) != 0
          ) {
      if (bVar1) {
        BamTools::BamAlignment::GetEndPosition(SUB81(local_198,0),false);
        std::make_pair<int,int>(&in_stack_fffffffffffffd78->first,(int *)0x104b4b);
        std::
        queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::push(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        local_1a4 = 1;
        bVar1 = false;
      }
      else {
        iVar4 = local_ec + 1;
        BamTools::BamAlignment::GetEndPosition(SUB81(local_198,0),false);
        while ((bVar3 = std::
                        queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        ::empty((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                 *)0x104c0c), ((bVar3 ^ 0xffU) & 1) != 0 &&
               (pvVar6 = std::
                         queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         ::front((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                  *)0x104c2b), pvVar6->second < iVar4))) {
          std::
          queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::pop((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 *)0x104c58);
        }
        std::make_pair<int&,int&>(&in_stack_fffffffffffffd78->first,(int *)0x104c73);
        std::
        queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::push(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        sVar7 = std::
                queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::size((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)0x104ca5);
        if ((ulong)(long)local_1a4 < sVar7) {
          sVar7 = std::
                  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  ::size((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)0x104ccb);
          local_1a4 = (int)sVar7;
        }
      }
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Maximum depth: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1a4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::
    queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::~queue((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)0x104d33);
    BamTools::BamAlignment::~BamAlignment(local_198);
    BamTools::BamReader::~BamReader(local_10);
    return;
  }
  BamTools::BamReader::GetFilename_abi_cxx11_();
  poVar5 = std::operator<<((ostream *)&std::cerr,local_40);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Couldn\'t open Bamfile");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void countCoverage(string filename) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;

    int currentStart =0;
    int currentEnd =0;
    int maxDepth =0;
    std::queue<std::pair<int,int>> positions;
    bool firstAlignment = true;

     while (bamreader.GetNextAlignment(alignment)){

        //Working with the first alignment
        if(firstAlignment){
            positions.push(std::make_pair((alignment.Position+1),alignment.GetEndPosition()));
            maxDepth = 1;
            firstAlignment = false;
            continue;
        }

        //For all alignments other than the first alignment

        //Assigning the positions
        currentStart = (alignment.Position+1);
        currentEnd = alignment.GetEndPosition();

        //cout<<"current start1: "<<currentStartPair1<<" end1: "<<currentEndPair1<<endl;

        while(!positions.empty()){
            //cout<<"start1: "<<firstMatePositions.front().first<<" end1: "<<firstMatePositions.front().second<<endl;
            int endPair1 = positions.front().second;
            if(currentStart>endPair1 ){
                //cout<<"pop"<<endl;
                positions.pop();
                continue;
            }
            break;
        }

        positions.push(std::make_pair(currentStart,currentEnd));

        if((positions.size())>maxDepth){
            maxDepth = positions.size();

        }
    }
     cout<<"Maximum depth: "<<maxDepth<<endl;

}